

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utest.h
# Opt level: O1

int utest_main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  __time_t _Var5;
  __time_t _Var6;
  int iVar7;
  long lVar8;
  long lVar9;
  char **__ptr;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int result;
  char *colours [3];
  timespec ts;
  long local_a0;
  char *local_98;
  int local_8c;
  long local_88;
  char **local_80;
  char *local_78 [4];
  timespec local_58;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_80 = argv;
  iVar7 = isatty(1);
  local_78[2] = "\x1b[31m";
  local_78[0] = "\x1b[0m";
  local_78[1] = "\x1b[32m";
  if (iVar7 == 0) {
    lVar8 = 0;
    do {
      local_78[lVar8] = "";
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  if ((uint)argc < 2) {
    local_98 = (char *)0x0;
LAB_0010b83a:
    if (utest_state.tests_length == 0) {
      lVar8 = 0;
    }
    else {
      lVar9 = 0x10;
      lVar8 = 0;
      uVar11 = 0;
      do {
        iVar7 = utest_should_filter_test
                          (local_98,*(char **)((long)&(utest_state.tests)->func + lVar9));
        lVar8 = lVar8 + (ulong)(iVar7 == 0);
        uVar11 = uVar11 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar11 < utest_state.tests_length);
    }
    printf("%s[==========]%s Running %lu test cases.\n",local_78[1],local_78[0],lVar8);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)utest_state.output);
      fprintf((FILE *)utest_state.output,"<testsuites tests=\"%lu\" name=\"All\">\n",lVar8);
      fprintf((FILE *)utest_state.output,"<testsuite name=\"Tests\" tests=\"%lu\">\n",lVar8);
    }
    if (utest_state.tests_length == 0) {
      __ptr = (char **)0x0;
      lVar9 = 0;
      local_a0 = 0;
    }
    else {
      lVar12 = 0;
      local_a0 = 0;
      lVar9 = 0;
      __ptr = (char **)0x0;
      pcVar10 = (char *)0x0;
      do {
        local_8c = 0;
        iVar7 = utest_should_filter_test
                          (local_98,*(char **)((long)&(utest_state.tests)->name + lVar12));
        if (iVar7 == 0) {
          local_48 = local_78[1];
          local_40 = local_78[0];
          local_88 = lVar9;
          local_80 = __ptr;
          printf("%s[ RUN      ]%s %s\n",local_78[1],local_78[0],
                 *(undefined8 *)((long)&(utest_state.tests)->name + lVar12));
          if (utest_state.output != (FILE *)0x0) {
            fprintf((FILE *)utest_state.output,"<testcase name=\"%s\">",
                    *(undefined8 *)((long)&(utest_state.tests)->name + lVar12));
          }
          clock_gettime(0,&local_58);
          _Var5 = local_58.tv_sec;
          local_38 = local_58.tv_nsec;
          (**(code **)((long)&(utest_state.tests)->func + lVar12))
                    (&local_8c,*(undefined8 *)((long)&(utest_state.tests)->index + lVar12));
          clock_gettime(0,&local_58);
          lVar9 = local_58.tv_nsec;
          _Var6 = local_58.tv_sec;
          if (utest_state.output != (FILE *)0x0) {
            fwrite("</testcase>\n",0xc,1,(FILE *)utest_state.output);
          }
          lVar3 = local_88;
          lVar13 = (lVar9 - local_38) + (_Var6 - _Var5) * 1000000000;
          if (local_8c == 0) {
            printf("%s[       OK ]%s %s (%ldns)\n",local_48,local_40,
                   *(undefined8 *)((long)&(utest_state.tests)->name + lVar12),lVar13);
            __ptr = local_80;
            lVar9 = local_88;
          }
          else {
            lVar9 = local_88 + 1;
            __ptr = (char **)realloc(local_80,local_88 * 8 + 8);
            __ptr[lVar3] = pcVar10;
            local_a0 = local_a0 + 1;
            printf("%s[  FAILED  ]%s %s (%ldns)\n",local_78[2],local_78[0],
                   *(undefined8 *)((long)&(utest_state.tests)->name + lVar12),lVar13);
          }
        }
        pcVar10 = pcVar10 + 1;
        lVar12 = lVar12 + 0x18;
      } while (pcVar10 < utest_state.tests_length);
    }
    pcVar4 = local_78[1];
    pcVar10 = local_78[0];
    printf("%s[==========]%s %lu test cases ran.\n",local_78[1],local_78[0],lVar8);
    printf("%s[  PASSED  ]%s %lu tests.\n",pcVar4,pcVar10,lVar8 - local_a0);
    pcVar4 = local_78[2];
    if ((local_a0 != 0) &&
       (printf("%s[  FAILED  ]%s %lu tests, listed below:\n",local_78[2],pcVar10,local_a0),
       lVar9 != 0)) {
      lVar8 = 0;
      do {
        printf("%s[  FAILED  ]%s %s\n",pcVar4,pcVar10,utest_state.tests[(long)__ptr[lVar8]].name);
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
    }
    if (utest_state.output != (FILE *)0x0) {
      fwrite("</testsuite>\n</testsuites>\n",0x1b,1,(FILE *)utest_state.output);
    }
LAB_0010bb96:
    if (utest_state.tests_length != 0) {
      lVar8 = 0x10;
      uVar11 = 0;
      do {
        free(*(void **)((long)&(utest_state.tests)->func + lVar8));
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0x18;
      } while (uVar11 < utest_state.tests_length);
    }
    free(__ptr);
    free(utest_state.tests);
    if (utest_state.output != (FILE *)0x0) {
      fclose((FILE *)utest_state.output);
    }
    return (int)local_a0;
  }
  local_88 = (long)argc;
  lVar8 = 1;
  local_98 = (char *)0x0;
LAB_0010b79e:
  pcVar10 = local_80[lVar8];
  lVar9 = 0;
  do {
    cVar1 = pcVar10[lVar9];
    cVar2 = (&DAT_0015f03d)[lVar9];
    if (cVar1 != cVar2) break;
    iVar7 = (int)lVar9;
    lVar9 = lVar9 + 1;
  } while (iVar7 != 5);
  if (cVar1 == cVar2) {
    puts(
        "utest.h - the single file unit testing solution for C/C++!\nCommand line Options:\n  --help            Show this message and exit.\n  --filter=<filter> Filter the test cases to run (EG. MyTest*.a would run MyTestCase.a but not MyTestCase.b).\n  --output=<output> Output an xunit XML file to the file specified in <output>."
        );
  }
  else {
    lVar9 = 0;
    do {
      if (pcVar10[lVar9] != (&DAT_0015f044)[lVar9]) {
        lVar9 = 0;
        goto LAB_0010b807;
      }
      lVar9 = lVar9 + 1;
    } while ((int)lVar9 != 9);
    local_98 = pcVar10 + 9;
  }
  goto LAB_0010b7f0;
  while (lVar9 = lVar9 + 1, (int)lVar9 != 9) {
LAB_0010b807:
    if (pcVar10[lVar9] != "--output="[lVar9]) goto LAB_0010b7f0;
  }
  utest_state.output = (FILE *)fopen(pcVar10 + 9,"w+");
LAB_0010b7f0:
  if (cVar1 == cVar2) {
    local_a0 = 0;
    __ptr = (char **)0x0;
    goto LAB_0010bb96;
  }
  lVar8 = lVar8 + 1;
  if (lVar8 == local_88) goto LAB_0010b83a;
  goto LAB_0010b79e;
}

Assistant:

UTEST_WEAK int utest_main(int argc, const char *const argv[]) {
  uint64_t failed = 0;
  size_t index = 0;
  size_t *failed_testcases = 0;
  size_t failed_testcases_length = 0;
  const char *filter = 0;
  uint64_t ran_tests = 0;

  enum colours { RESET, GREEN, RED };

  const int use_colours = UTEST_COLOUR_OUTPUT();
  const char *colours[] = {"\033[0m", "\033[32m", "\033[31m"};
  if (!use_colours) {
    for (index = 0; index < sizeof colours / sizeof colours[0]; index++) {
      colours[index] = "";
    }
  }
  /* loop through all arguments looking for our options */
  for (index = 1; index < UTEST_CAST(size_t, argc); index++) {
    const char help_str[] = "--help";
    const char filter_str[] = "--filter=";
    const char output_str[] = "--output=";

    if (0 == utest_strncmp(argv[index], help_str, strlen(help_str))) {
      printf("utest.h - the single file unit testing solution for C/C++!\n"
             "Command line Options:\n"
             "  --help            Show this message and exit.\n"
             "  --filter=<filter> Filter the test cases to run (EG. MyTest*.a "
             "would run MyTestCase.a but not MyTestCase.b).\n"
             "  --output=<output> Output an xunit XML file to the file "
             "specified in <output>.\n");
      goto cleanup;
    } else if (0 ==
               utest_strncmp(argv[index], filter_str, strlen(filter_str))) {
      /* user wants to filter what test cases run! */
      filter = argv[index] + strlen(filter_str);
    } else if (0 ==
               utest_strncmp(argv[index], output_str, strlen(output_str))) {
      utest_state.output = utest_fopen(argv[index] + strlen(output_str), "w+");
    }
  }

  for (index = 0; index < utest_state.tests_length; index++) {
    if (utest_should_filter_test(filter, utest_state.tests[index].name)) {
      continue;
    }

    ran_tests++;
  }

  printf("%s[==========]%s Running %" UTEST_PRIu64 " test cases.\n",
         colours[GREEN], colours[RESET], UTEST_CAST(uint64_t, ran_tests));

  if (utest_state.output) {
    fprintf(utest_state.output, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
    fprintf(utest_state.output,
            "<testsuites tests=\"%" UTEST_PRIu64 "\" name=\"All\">\n",
            UTEST_CAST(uint64_t, ran_tests));
    fprintf(utest_state.output,
            "<testsuite name=\"Tests\" tests=\"%" UTEST_PRIu64 "\">\n",
            UTEST_CAST(uint64_t, ran_tests));
  }

  for (index = 0; index < utest_state.tests_length; index++) {
    int result = 0;
    int64_t ns = 0;

    if (utest_should_filter_test(filter, utest_state.tests[index].name)) {
      continue;
    }

    printf("%s[ RUN      ]%s %s\n", colours[GREEN], colours[RESET],
           utest_state.tests[index].name);

    if (utest_state.output) {
      fprintf(utest_state.output, "<testcase name=\"%s\">",
              utest_state.tests[index].name);
    }

    ns = utest_ns();
    utest_state.tests[index].func(&result, utest_state.tests[index].index);
    ns = utest_ns() - ns;

    if (utest_state.output) {
      fprintf(utest_state.output, "</testcase>\n");
    }

    if (0 != result) {
      const size_t failed_testcase_index = failed_testcases_length++;
      failed_testcases = UTEST_PTR_CAST(
          size_t *, realloc(UTEST_PTR_CAST(void *, failed_testcases),
                            sizeof(size_t) * failed_testcases_length));
      failed_testcases[failed_testcase_index] = index;
      failed++;
      printf("%s[  FAILED  ]%s %s (%" UTEST_PRId64 "ns)\n", colours[RED],
             colours[RESET], utest_state.tests[index].name, ns);
    } else {
      printf("%s[       OK ]%s %s (%" UTEST_PRId64 "ns)\n", colours[GREEN],
             colours[RESET], utest_state.tests[index].name, ns);
    }
  }

  printf("%s[==========]%s %" UTEST_PRIu64 " test cases ran.\n", colours[GREEN],
         colours[RESET], ran_tests);
  printf("%s[  PASSED  ]%s %" UTEST_PRIu64 " tests.\n", colours[GREEN],
         colours[RESET], ran_tests - failed);

  if (0 != failed) {
    printf("%s[  FAILED  ]%s %" UTEST_PRIu64 " tests, listed below:\n",
           colours[RED], colours[RESET], failed);
    for (index = 0; index < failed_testcases_length; index++) {
      printf("%s[  FAILED  ]%s %s\n", colours[RED], colours[RESET],
             utest_state.tests[failed_testcases[index]].name);
    }
  }

  if (utest_state.output) {
    fprintf(utest_state.output, "</testsuite>\n</testsuites>\n");
  }

cleanup:
  for (index = 0; index < utest_state.tests_length; index++) {
    free(UTEST_PTR_CAST(void *, utest_state.tests[index].name));
  }

  free(UTEST_PTR_CAST(void *, failed_testcases));
  free(UTEST_PTR_CAST(void *, utest_state.tests));

  if (utest_state.output) {
    fclose(utest_state.output);
  }

  return UTEST_CAST(int, failed);
}